

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gf256.c
# Opt level: O0

int main(void)

{
  _Bool _Var1;
  char cVar2;
  int nfail;
  
  fprintf(_stderr,"Test: test_add\n");
  _Var1 = test_add();
  if (_Var1) {
    fprintf(_stderr,"--> pass\n");
  }
  else {
    fprintf(_stderr,"--> FAIL (test test_add)\n");
  }
  cVar2 = !_Var1;
  fprintf(_stderr,"Test: test_logexp\n");
  _Var1 = test_logexp();
  if (_Var1) {
    fprintf(_stderr,"--> pass\n");
  }
  else {
    fprintf(_stderr,"--> FAIL (test test_logexp)\n");
    cVar2 = cVar2 + '\x01';
  }
  fprintf(_stderr,"Test: test_mul\n");
  _Var1 = test_mul();
  if (_Var1) {
    fprintf(_stderr,"--> pass\n");
  }
  else {
    fprintf(_stderr,"--> FAIL (test test_mul)\n");
    cVar2 = cVar2 + '\x01';
  }
  fprintf(_stderr,"Test: test_inv\n");
  _Var1 = test_inv();
  if (_Var1) {
    fprintf(_stderr,"--> pass\n");
  }
  else {
    fprintf(_stderr,"--> FAIL (test test_inv)\n");
    cVar2 = cVar2 + '\x01';
  }
  return (uint)(cVar2 != '\0');
}

Assistant:

int main()
{
	int nfail = 0;
#define RUN_TEST(x) \
	do { \
		fprintf(stderr, "Test: " #x "\n"); \
		if (!x()) { \
			fprintf(stderr, "--> FAIL (test " #x ")\n"); \
			++nfail; \
		} else { \
			fprintf(stderr, "--> pass\n"); \
		} \
	} while(0)

	RUN_TEST(test_add);
	RUN_TEST(test_logexp);
	RUN_TEST(test_mul);
	RUN_TEST(test_inv);

#undef RUN_TEST
	return (nfail == 0 ? EXIT_SUCCESS : EXIT_FAILURE);
}